

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::SetElementIWithCache<true>
               (Var receiver,RecyclableObject *object,RecyclableObject *index,Var value,
               PropertyRecordUsageCache *propertyRecordUsageCache,ScriptContext *scriptContext,
               PropertyOperationFlags flags,PropertyCacheOperationInfo *operationInfo)

{
  PropertyRecord *this;
  bool bVar1;
  uint32 index_00;
  int iVar2;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  
  info._56_8_ = operationInfo;
  bVar1 = TaggedNumber::Is(receiver);
  if (bVar1) {
    bVar1 = SetElementIOnTaggedNumber(receiver,object,index,value,scriptContext,flags);
    return bVar1;
  }
  this = (propertyRecordUsageCache->propertyRecord).ptr;
  if (this->isNumeric == true) {
    index_00 = PropertyRecord::GetNumericValue(this);
    iVar2 = SetItem(receiver,object,index_00,value,scriptContext,flags,0);
  }
  else {
    local_a0 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    if (((RecyclableObject *)receiver == object) &&
       (bVar1 = PropertyRecordUsageCache::TrySetPropertyFromCache<true>
                          (propertyRecordUsageCache,object,value,scriptContext,flags,
                           (PropertyValueInfo *)local_a0,index,
                           (PropertyCacheOperationInfo *)info._56_8_), bVar1)) {
      return true;
    }
    iVar2 = this->pid;
    if ((iVar2 == 0x105) || (iVar2 == 0xba)) {
      iVar2 = SetProperty(receiver,object,iVar2,value,scriptContext,flags);
    }
    else {
      iVar2 = SetPropertyWPCache<int>
                        (receiver,object,iVar2,value,scriptContext,flags,
                         (PropertyValueInfo *)local_a0);
    }
  }
  return iVar2 != 0;
}

Assistant:

bool JavascriptOperators::SetElementIWithCache(
        _In_ Var receiver,
        _In_ RecyclableObject* object,
        _In_ RecyclableObject* index,
        _In_ Var value,
        _In_ PropertyRecordUsageCache* propertyRecordUsageCache,
        _In_ ScriptContext* scriptContext,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyCacheOperationInfo* operationInfo)
    {
        if (TaggedNumber::Is(receiver))
        {
            return JavascriptOperators::SetElementIOnTaggedNumber(receiver, object, index, value, scriptContext, flags);
        }

        PropertyRecord const * propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
        if (propertyRecord->IsNumeric())
        {
            return JavascriptOperators::SetItem(receiver, object, propertyRecord->GetNumericValue(), value, scriptContext, flags);
        }
        PropertyValueInfo info;
        if (receiver == object)
        {
            if (propertyRecordUsageCache->TrySetPropertyFromCache<ReturnOperationInfo>(object, value, scriptContext, flags, &info, index, operationInfo))
            {
                return true;
            }
        }
        PropertyId propId = propertyRecord->GetPropertyId();
        if (propId == PropertyIds::NaN || propId == PropertyIds::Infinity)
        {
            // As we no longer convert o[x] into o.x for NaN and Infinity, we need to follow SetProperty convention for these,
            // which would check for read-only properties, strict mode, etc.
            // Note that "-Infinity" does not qualify as property name, so we don't have to take care of it.
            return JavascriptOperators::SetProperty(receiver, object, propId, value, scriptContext, flags);
        }
        return JavascriptOperators::SetPropertyWPCache(receiver, object, propId, value, scriptContext, flags, &info);
    }